

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_utils.hpp
# Opt level: O2

string * PlatformUtilsGetEnv_abi_cxx11_(string *__return_storage_ptr__,char *name)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = getenv(name);
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string PlatformUtilsGetEnv(const char* name) {
    auto str = detail::ImplGetEnv(name);
    if (str == nullptr) {
        return {};
    }
    return str;
}